

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::~ColladaLoader(ColladaLoader *this)

{
  ColladaLoader *this_local;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0104bde0;
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::~vector(&this->mAnims);
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::~vector(&this->mTextures);
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::~vector(&this->mLights);
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::~vector(&this->mCameras);
  std::
  vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  ::~vector(&this->newMats);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(&this->mTargetMeshes);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(&this->mMeshes);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map(&this->mMaterialIndexByName);
  std::
  map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::~map(&this->mMeshIndexByID);
  std::__cxx11::string::~string((string *)&this->mFileName);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

ColladaLoader::~ColladaLoader() {
    // empty
}